

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  bool bVar1;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_68;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_60;
  Ref *local_58;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_50;
  __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
  local_48;
  ValueType local_40;
  size_t local_38;
  u32 local_30;
  u32 local_2c;
  u32 size_local;
  u32 offset_local;
  Store *store_local;
  Table *this_local;
  Ref ref_local;
  
  local_40 = *(ValueType *)&(this->type_).super_ExternType.field_0xc;
  local_38 = ref.index;
  local_30 = size;
  local_2c = offset;
  _size_local = store;
  store_local = (Store *)this;
  this_local = (Table *)ref.index;
  bVar1 = Store::HasValueType(store,ref,local_40);
  if (!bVar1) {
    __assert_fail("store.HasValueType(ref, type_.element)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                  ,0x216,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
  }
  bVar1 = IsValidRange(this,local_2c,local_30);
  if (bVar1) {
    local_50._M_current =
         (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                          (&this->elements_);
    local_48 = __gnu_cxx::
               __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
               ::operator+(&local_50,(ulong)local_2c);
    local_68._M_current =
         (Ref *)std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::begin
                          (&this->elements_);
    local_60 = __gnu_cxx::
               __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
               ::operator+(&local_68,(ulong)local_2c);
    local_58 = (Ref *)__gnu_cxx::
                      __normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                      ::operator+(&local_60,(ulong)local_30);
    std::
    fill<__gnu_cxx::__normal_iterator<wabt::interp::Ref*,std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>>,wabt::interp::Ref>
              (local_48,(__normal_iterator<wabt::interp::Ref_*,_std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>_>
                         )local_58,(Ref *)&this_local);
    Result::Result((Result *)((long)&ref_local.index + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&ref_local.index + 4),Error);
  }
  return (Result)ref_local.index._4_4_;
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}